

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_connect_op.hpp
# Opt level: O0

void asio::detail::
     reactive_socket_connect_op<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  long in_RSI;
  long in_RDI;
  fenced_block b;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>
  handler;
  handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_asio::system_executor>
  w;
  ptr p;
  reactive_socket_connect_op<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9)>
  *o;
  undefined4 in_stack_ffffffffffffff88;
  half_t in_stack_ffffffffffffff8c;
  gcc_x86_fenced_block *in_stack_ffffffffffffff90;
  undefined1 local_60 [16];
  ptr *in_stack_ffffffffffffffb0;
  handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_asio::system_executor>
  local_41;
  undefined1 *local_40;
  long local_28;
  long local_8;
  
  local_40 = (undefined1 *)(in_RSI + 0x40);
  local_28 = in_RSI;
  local_8 = in_RDI;
  handler_work<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9),_asio::system_executor>
  ::handler_work(&local_41,(anon_class_8_1_8991fb9c *)(in_RSI + 0x40));
  binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9),_std::error_code>
  ::binder1((binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>
             *)local_60,(anon_class_8_1_8991fb9c *)(local_28 + 0x40),(error_code *)(local_28 + 0x18)
           );
  local_40 = local_60;
  ptr::reset(in_stack_ffffffffffffffb0);
  if (local_8 != 0) {
    gcc_x86_fenced_block::gcc_x86_fenced_block(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    handler_work<tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::$_0,asio::system_executor>
    ::
    complete<asio::detail::binder1<tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::__0,std::error_code>>
              ((handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_asio::system_executor>
                *)in_stack_ffffffffffffff90,
               (binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>
                *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (anon_class_8_1_8991fb9c *)0x219a61);
    gcc_x86_fenced_block::~gcc_x86_fenced_block(in_stack_ffffffffffffff90);
  }
  handler_work<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1590:9),_asio::system_executor>
  ::~handler_work(&local_41);
  ptr::~ptr((ptr *)0x219aad);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    reactive_socket_connect_op* o
      (static_cast<reactive_socket_connect_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };
    handler_work<Handler> w(o->handler_);

    ASIO_HANDLER_COMPLETION((*o));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder1<Handler, asio::error_code>
      handler(o->handler_, o->ec_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }